

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_importedUnitsUsingUnitWhichIsAnImportedUnits_Test::TestBody
          (ModelFlattening_importedUnitsUsingUnitWhichIsAnImportedUnits_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_218 [8];
  Message local_210 [8];
  undefined1 local_208 [16];
  AssertionResult gtest_ar;
  ModelPtr flattenedModel;
  AssertHelper local_1c0 [8];
  Message local_1b8 [15];
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [32];
  undefined1 local_120 [8];
  ModelPtr unitsDefinitionsModel;
  ModelPtr importModel;
  ModelPtr model;
  ValidatorPtr validator;
  ParserPtr parser;
  ImporterPtr importer;
  string local_b8 [8];
  string e;
  string local_90 [8];
  string modelString;
  string local_68 [8];
  string importModelString;
  allocator<char> local_31;
  string local_30 [8];
  string unitsDefinitionsModelString;
  ModelFlattening_importedUnitsUsingUnitWhichIsAnImportedUnits_Test *this_local;
  
  unitsDefinitionsModelString.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"units_definitions\">\n  <units name=\"more_mm\">\n    <unit prefix=\"milli\" units=\"second\"/>\n  </units>\n</model>"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"base\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"units_definitions.cellml\">\n    <units units_ref=\"more_mm\" name=\"more_mm\"/>\n  </import>\n  <units name=\"mm_sq\">\n    <unit units=\"mm\"/>\n    <unit units=\"more_mm\"/>\n  </units>\n  <units name=\"mm\">\n    <unit prefix=\"milli\" units=\"second\"/>\n  </units>\n  <component name=\"base\">\n    <variable name=\"var1\" units=\"mm_sq\"/>\n  </component>\n</model>"
             ,(allocator<char> *)(modelString.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(modelString.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"base.cellml\">\n    <component component_ref=\"base\" name=\"base\"/>\n  </import>\n</model>"
             ,(allocator<char> *)(e.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(e.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n  <units name=\"mm\">\n    <unit prefix=\"milli\" units=\"metre\"/>\n  </units>\n  <units name=\"mm_sq\">\n    <unit units=\"mm\"/>\n    <unit units=\"mm\"/>\n  </units>\n  <component name=\"base\">\n    <variable name=\"var1\" units=\"mm_sq\"/>\n  </component>\n</model>\n"
             ,(allocator<char> *)
              ((long)&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Importer::create((bool)((char)&parser + '\b'));
  this_00 = &validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  libcellml::Validator::create();
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel
            ((string *)
             &importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Parser::parseModel
            ((string *)
             &unitsDefinitionsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Parser::parseModel((string *)local_120);
  peVar3 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"base.cellml",&local_141);
  libcellml::Importer::addModel
            ((shared_ptr *)peVar3,
             (string *)
             &unitsDefinitionsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  peVar3 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_168,"units_definitions.cellml",&local_169);
  libcellml::Importer::addModel((shared_ptr *)peVar3,(string *)local_120);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  peVar3 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_190,".",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Importer::resolveImports
            ((shared_ptr *)peVar3,
             (string *)
             &importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  bVar1 = libcellml::Model::hasUnresolvedImports();
  local_1a9 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar2) {
    testing::Message::Message(local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               &flattenedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_1a8,"model->hasUnresolvedImports()","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x6d0,pcVar4);
    testing::internal::AssertHelper::operator=(local_1c0,local_1b8);
    testing::internal::AssertHelper::~AssertHelper(local_1c0);
    std::__cxx11::string::~string
              ((string *)
               &flattenedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar.message_);
  local_208._0_8_ = (element_type *)0x0;
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_208 + 8,"nullptr",(void **)"flattenedModel",
             (shared_ptr<libcellml::Model> *)local_208,&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_208 + 8));
  if (!bVar2) {
    testing::Message::Message(local_210);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)(local_208 + 8));
    testing::internal::AssertHelper::AssertHelper
              (local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x6d3,pcVar4);
    testing::internal::AssertHelper::operator=(local_218,local_210);
    testing::internal::AssertHelper::~AssertHelper(local_218);
    testing::Message::~Message(local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_208 + 8));
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&gtest_ar.message_)
  ;
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_120);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &unitsDefinitionsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Validator>::~shared_ptr
            ((shared_ptr<libcellml::Validator> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(ModelFlattening, importedUnitsUsingUnitWhichIsAnImportedUnits)
{
    const std::string unitsDefinitionsModelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"units_definitions\">\n"
        "  <units name=\"more_mm\">\n"
        "    <unit prefix=\"milli\" units=\"second\"/>\n"
        "  </units>\n"
        "</model>";
    const std::string importModelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"base\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"units_definitions.cellml\">\n"
        "    <units units_ref=\"more_mm\" name=\"more_mm\"/>\n"
        "  </import>\n"
        "  <units name=\"mm_sq\">\n"
        "    <unit units=\"mm\"/>\n"
        "    <unit units=\"more_mm\"/>\n"
        "  </units>\n"
        "  <units name=\"mm\">\n"
        "    <unit prefix=\"milli\" units=\"second\"/>\n"
        "  </units>\n"
        "  <component name=\"base\">\n"
        "    <variable name=\"var1\" units=\"mm_sq\"/>\n"
        "  </component>\n"
        "</model>";
    const std::string modelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"base.cellml\">\n"
        "    <component component_ref=\"base\" name=\"base\"/>\n"
        "  </import>\n"
        "</model>";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n"
        "  <units name=\"mm\">\n"
        "    <unit prefix=\"milli\" units=\"metre\"/>\n"
        "  </units>\n"
        "  <units name=\"mm_sq\">\n"
        "    <unit units=\"mm\"/>\n"
        "    <unit units=\"mm\"/>\n"
        "  </units>\n"
        "  <component name=\"base\">\n"
        "    <variable name=\"var1\" units=\"mm_sq\"/>\n"
        "  </component>\n"
        "</model>\n";

    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();
    auto validator = libcellml::Validator::create();

    auto model = parser->parseModel(modelString);
    auto importModel = parser->parseModel(importModelString);
    auto unitsDefinitionsModel = parser->parseModel(unitsDefinitionsModelString);

    importer->addModel(importModel, "base.cellml");
    importer->addModel(unitsDefinitionsModel, "units_definitions.cellml");

    importer->resolveImports(model, ".");
    EXPECT_TRUE(model->hasUnresolvedImports());

    auto flattenedModel = importer->flattenModel(model);
    EXPECT_EQ(nullptr, flattenedModel);
}